

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O1

FxExpression * __thiscall FxStructMember::Resolve(FxStructMember *this,FCompileContext *ctx)

{
  EFxType EVar1;
  PType *pPVar2;
  _func_int **pp_Var3;
  PField *pPVar4;
  PClass *pPVar5;
  int iVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  _func_int *UNRECOVERED_JUMPTABLE;
  FxBitOp *this_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  PPointer *pPVar7;
  undefined4 extraout_var_03;
  PClass *pPVar8;
  undefined4 extraout_var_04;
  PClass *pPVar9;
  PField *pPVar10;
  undefined4 extraout_var_05;
  FxExpression *l;
  FxConstant *pFVar11;
  char *pcVar12;
  FxExpression *pFVar13;
  bool bVar14;
  FName local_3c;
  FName local_38;
  FName local_34;
  
  if ((this->super_FxExpression).isresolved != false) {
    return &this->super_FxExpression;
  }
  (this->super_FxExpression).isresolved = true;
  pFVar13 = this->classx;
  if (pFVar13 != (FxExpression *)0x0) {
    iVar6 = (*pFVar13->_vptr_FxExpression[2])(pFVar13,ctx);
    this->classx = (FxExpression *)CONCAT44(extraout_var,iVar6);
  }
  pPVar9 = PPointer::RegistrationInfo.MyClass;
  if (this->classx != (FxExpression *)0x0) {
    pPVar2 = this->classx->ValueType;
    pPVar8 = (pPVar2->super_PTypeBase).super_DObject.Class;
    if (*(int *)&(this->membervar->super_PSymbol).super_PTypeBase.super_DObject.field_0x24 == 0x249)
    {
      if (pPVar8 == (PClass *)0x0) {
        iVar6 = (**(pPVar2->super_PTypeBase).super_DObject._vptr_DObject)(pPVar2);
        (pPVar2->super_PTypeBase).super_DObject.Class = (PClass *)CONCAT44(extraout_var_00,iVar6);
      }
      pPVar5 = AActor::RegistrationInfo.MyClass;
      pPVar8 = (pPVar2->super_PTypeBase).super_DObject.Class;
      bVar14 = pPVar8 != (PClass *)0x0;
      if (pPVar8 != pPVar9 && bVar14) {
        do {
          pPVar8 = pPVar8->ParentClass;
          bVar14 = pPVar8 != (PClass *)0x0;
          if (pPVar8 == pPVar9) break;
        } while (pPVar8 != (PClass *)0x0);
      }
      if (bVar14) {
        pp_Var3 = this->classx->ValueType[1].super_PTypeBase.super_DObject._vptr_DObject;
        if (pp_Var3[1] == (_func_int *)0x0) {
          UNRECOVERED_JUMPTABLE = (_func_int *)(**(code **)*pp_Var3)(pp_Var3);
          pp_Var3[1] = UNRECOVERED_JUMPTABLE;
        }
        pPVar9 = (PClass *)pp_Var3[1];
        bVar14 = pPVar9 != (PClass *)0x0;
        if (pPVar9 != pPVar5 && bVar14) {
          do {
            pPVar9 = pPVar9->ParentClass;
            bVar14 = pPVar9 != (PClass *)0x0;
            if (pPVar9 == pPVar5) break;
          } while (pPVar9 != (PClass *)0x0);
        }
        if (bVar14) {
          this_00 = (FxBitOp *)FMemArena::Alloc(&FxAlloc,0x38);
          pFVar13 = this->classx;
          (this_00->super_FxBinary).super_FxExpression._vptr_FxExpression =
               (_func_int **)&PTR__FxExpression_00711370;
          FScriptPosition::FScriptPosition
                    (&(this_00->super_FxBinary).super_FxExpression.ScriptPosition,
                     &(this->super_FxExpression).ScriptPosition);
          (this_00->super_FxBinary).super_FxExpression.ValueType = (PType *)0x0;
          (this_00->super_FxBinary).super_FxExpression.isresolved = false;
          (this_00->super_FxBinary).super_FxExpression.NeedResult = true;
          (this_00->super_FxBinary).super_FxExpression.ExprType = EFX_ClassDefaults;
          (this_00->super_FxBinary).super_FxExpression._vptr_FxExpression =
               (_func_int **)&PTR__FxClassDefaults_00710790;
          *(FxExpression **)&(this_00->super_FxBinary).Operator = pFVar13;
          *(undefined1 *)&(this_00->super_FxBinary).left = 0;
          this->classx = (FxExpression *)0x0;
          (*(this->super_FxExpression)._vptr_FxExpression[1])(this);
          UNRECOVERED_JUMPTABLE = (this_00->super_FxBinary).super_FxExpression._vptr_FxExpression[2]
          ;
LAB_0053387f:
          iVar6 = (*UNRECOVERED_JUMPTABLE)(this_00,ctx);
          return (FxExpression *)CONCAT44(extraout_var_01,iVar6);
        }
      }
      pcVar12 = "\'Default\' requires an actor type.";
    }
    else {
      if (pPVar8 == (PClass *)0x0) {
        iVar6 = (**(pPVar2->super_PTypeBase).super_DObject._vptr_DObject)(pPVar2);
        (pPVar2->super_PTypeBase).super_DObject.Class = (PClass *)CONCAT44(extraout_var_02,iVar6);
      }
      pPVar5 = PStruct::RegistrationInfo.MyClass;
      pPVar8 = (pPVar2->super_PTypeBase).super_DObject.Class;
      bVar14 = pPVar8 != (PClass *)0x0;
      if (pPVar8 != pPVar9 && bVar14) {
        do {
          pPVar8 = pPVar8->ParentClass;
          bVar14 = pPVar8 != (PClass *)0x0;
          if (pPVar8 == pPVar9) break;
        } while (pPVar8 != (PClass *)0x0);
      }
      pPVar2 = this->classx->ValueType;
      if (!bVar14) {
        if ((pPVar2->super_PTypeBase).super_DObject.Class == (PClass *)0x0) {
          iVar6 = (**(pPVar2->super_PTypeBase).super_DObject._vptr_DObject)(pPVar2);
          (pPVar2->super_PTypeBase).super_DObject.Class = (PClass *)CONCAT44(extraout_var_04,iVar6);
        }
        pPVar9 = (pPVar2->super_PTypeBase).super_DObject.Class;
        bVar14 = pPVar9 != (PClass *)0x0;
        if (pPVar9 != pPVar5 && bVar14) {
          do {
            pPVar9 = pPVar9->ParentClass;
            bVar14 = pPVar9 != (PClass *)0x0;
            if (pPVar9 == pPVar5) break;
          } while (pPVar9 != (PClass *)0x0);
        }
        if (bVar14) {
          pFVar13 = this->classx;
          EVar1 = pFVar13->ExprType;
          if ((int)EVar1 < 0x42) {
            if (EVar1 - EFX_ClassMember < 2) {
              pcVar12 = pFVar13[1].ScriptPosition.FileName.Chars;
              pPVar10 = (PField *)
                        M_Malloc_Dbg(0x40,
                                     "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/./dobject.h"
                                     ,0x1f9);
              pPVar4 = this->membervar;
              local_34.Index =
                   *(int *)&(pPVar4->super_PSymbol).super_PTypeBase.super_DObject.field_0x24;
              PField::PField(pPVar10,&local_34,pPVar4->Type,
                             *(uint *)(pcVar12 + 0x38) | pPVar4->Flags,
                             *(long *)(pcVar12 + 0x28) + pPVar4->Offset,0);
              pPVar10->BitValue = this->membervar->BitValue;
              pFVar13 = this->classx;
              pFVar13[1].ScriptPosition.FileName.Chars = (char *)pPVar10;
              goto LAB_00533bb8;
            }
            if (EVar1 == EFX_LocalVariable) {
              if (((PStruct *)pFVar13->ValueType == TypeVector2) ||
                 ((PStruct *)pFVar13->ValueType == TypeVector3)) {
                pPVar4 = this->membervar;
                *(int *)((long)&pFVar13[1].ScriptPosition.FileName.Chars + 4) =
                     (int)(pPVar4->Offset >> 3);
                pFVar13->ValueType = pPVar4->Type;
                this->classx = (FxExpression *)0x0;
                (*(this->super_FxExpression)._vptr_FxExpression[1])(this);
                return pFVar13;
              }
              if ((PStruct *)pFVar13->ValueType == TypeColorStruct) {
                iVar6 = *(int *)&(this->membervar->super_PSymbol).super_PTypeBase.super_DObject.
                                 field_0x24;
                bVar14 = true;
                if (iVar6 == 0x28f) {
                  iVar6 = 0x18;
                }
                else if (iVar6 == 0x291) {
                  iVar6 = 8;
                }
                else if (iVar6 == 0x290) {
                  iVar6 = 0x10;
                }
                else {
                  bVar14 = false;
                  iVar6 = 0;
                }
                pFVar13->ValueType = (PType *)TypeColor;
                l = pFVar13;
                if (bVar14) {
                  l = (FxExpression *)FMemArena::Alloc(&FxAlloc,0x40);
                  pFVar11 = (FxConstant *)FMemArena::Alloc(&FxAlloc,0x38);
                  FxConstant::FxConstant(pFVar11,iVar6,&(this->super_FxExpression).ScriptPosition);
                  FxShift::FxShift((FxShift *)l,0x117,pFVar13,(FxExpression *)pFVar11);
                }
                this_00 = (FxBitOp *)FMemArena::Alloc(&FxAlloc,0x40);
                pFVar11 = (FxConstant *)FMemArena::Alloc(&FxAlloc,0x38);
                FxConstant::FxConstant(pFVar11,0xff,&(this->super_FxExpression).ScriptPosition);
                FxBitOp::FxBitOp(this_00,0x26,l,(FxExpression *)pFVar11);
                this->classx = (FxExpression *)0x0;
                (*(this->super_FxExpression)._vptr_FxExpression[1])(this);
                UNRECOVERED_JUMPTABLE =
                     (this_00->super_FxBinary).super_FxExpression._vptr_FxExpression[2];
                goto LAB_0053387f;
              }
            }
          }
          else {
            if (EVar1 == EFX_GlobalVariable) {
              pp_Var3 = pFVar13[1]._vptr_FxExpression;
              pPVar10 = (PField *)
                        M_Malloc_Dbg(0x40,
                                     "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/./dobject.h"
                                     ,0x1f9);
              pPVar4 = this->membervar;
              local_38.Index =
                   *(int *)&(pPVar4->super_PSymbol).super_PTypeBase.super_DObject.field_0x24;
              PField::PField(pPVar10,&local_38,pPVar4->Type,*(uint *)(pp_Var3 + 7) | pPVar4->Flags,
                             (size_t)(pp_Var3[5] + pPVar4->Offset),0);
              pPVar10->BitValue = this->membervar->BitValue;
              pFVar13 = this->classx;
              pFVar13[1]._vptr_FxExpression = (_func_int **)pPVar10;
LAB_00533bb8:
              pFVar13->isresolved = false;
              iVar6 = (*pFVar13->_vptr_FxExpression[2])(pFVar13,ctx);
              this->classx = (FxExpression *)0x0;
              return (FxExpression *)CONCAT44(extraout_var_05,iVar6);
            }
            if (EVar1 == EFX_StackVariable) {
              pp_Var3 = pFVar13[1]._vptr_FxExpression;
              pPVar10 = (PField *)
                        M_Malloc_Dbg(0x40,
                                     "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/./dobject.h"
                                     ,0x1f9);
              pPVar4 = this->membervar;
              local_3c.Index =
                   *(int *)&(pPVar4->super_PSymbol).super_PTypeBase.super_DObject.field_0x24;
              PField::PField(pPVar10,&local_3c,pPVar4->Type,*(uint *)(pp_Var3 + 7) | pPVar4->Flags,
                             (size_t)(pp_Var3[5] + pPVar4->Offset),0);
              pPVar10->BitValue = this->membervar->BitValue;
              pFVar13 = this->classx;
              pp_Var3 = pFVar13[1]._vptr_FxExpression;
              *(uint *)(pp_Var3 + 4) = *(uint *)(pp_Var3 + 4) | 0x80;
              if (pp_Var3 != (_func_int **)0x0) {
                (**(code **)(*pp_Var3 + 0x10))();
              }
              pFVar13[1]._vptr_FxExpression = (_func_int **)pPVar10;
              pFVar13 = this->classx;
              goto LAB_00533bb8;
            }
          }
          iVar6 = (*pFVar13->_vptr_FxExpression[4])(pFVar13,ctx,&this->AddressWritable);
          if ((char)iVar6 == '\0') {
            FScriptPosition::Message
                      (&(this->super_FxExpression).ScriptPosition,2,
                       "unable to dereference left side of %s",
                       FName::NameData.NameArray
                       [*(int *)&(this->membervar->super_PSymbol).super_PTypeBase.super_DObject.
                                 field_0x24].Text);
            goto LAB_00533970;
          }
        }
LAB_00533b49:
        (this->super_FxExpression).ValueType = this->membervar->Type;
        return &this->super_FxExpression;
      }
      pPVar7 = dyn_cast<PPointer>((DObject *)pPVar2);
      pPVar9 = PStruct::RegistrationInfo.MyClass;
      if (pPVar7 != (PPointer *)0x0) {
        pPVar2 = pPVar7->PointedType;
        if ((pPVar2->super_PTypeBase).super_DObject.Class == (PClass *)0x0) {
          iVar6 = (**(pPVar2->super_PTypeBase).super_DObject._vptr_DObject)(pPVar2);
          (pPVar2->super_PTypeBase).super_DObject.Class = (PClass *)CONCAT44(extraout_var_03,iVar6);
        }
        pPVar8 = (pPVar2->super_PTypeBase).super_DObject.Class;
        bVar14 = pPVar8 != (PClass *)0x0;
        if (pPVar8 != pPVar9 && bVar14) {
          do {
            pPVar8 = pPVar8->ParentClass;
            bVar14 = pPVar8 != (PClass *)0x0;
            if (pPVar8 == pPVar9) break;
          } while (pPVar8 != (PClass *)0x0);
        }
        if (bVar14) goto LAB_00533b49;
      }
      pcVar12 = "Member variable requires a struct or class object.";
    }
    FScriptPosition::Message(&(this->super_FxExpression).ScriptPosition,2,pcVar12);
  }
LAB_00533970:
  (*(this->super_FxExpression)._vptr_FxExpression[1])(this);
  return (FxExpression *)0x0;
}

Assistant:

FxExpression *FxStructMember::Resolve(FCompileContext &ctx)
{
	CHECKRESOLVED();
	SAFE_RESOLVE(classx, ctx);

	if (membervar->SymbolName == NAME_Default)
	{
		if (!classx->ValueType->IsKindOf(RUNTIME_CLASS(PPointer))
			|| !static_cast<PPointer *>(classx->ValueType)->PointedType->IsKindOf(RUNTIME_CLASS(AActor)))
		{
			ScriptPosition.Message(MSG_ERROR, "'Default' requires an actor type.");
			delete this;
			return nullptr;
		}
		FxExpression * x = new FxClassDefaults(classx, ScriptPosition);
		classx = nullptr;
		delete this;
		return x->Resolve(ctx);
	}

	if (classx->ValueType->IsKindOf(RUNTIME_CLASS(PPointer)))
	{
		PPointer *ptrtype = dyn_cast<PPointer>(classx->ValueType);
		if (ptrtype == nullptr || !ptrtype->PointedType->IsKindOf(RUNTIME_CLASS(PStruct)))
		{
			ScriptPosition.Message(MSG_ERROR, "Member variable requires a struct or class object.");
			delete this;
			return nullptr;
		}
	}
	else if (classx->ValueType->IsKindOf(RUNTIME_CLASS(PStruct)))
	{
		// if this is a struct within a class or another struct we can simplify the expression by creating a new PField with a cumulative offset.
		if (classx->ExprType == EFX_ClassMember || classx->ExprType == EFX_StructMember)
		{
			auto parentfield = static_cast<FxStructMember *>(classx)->membervar;
			// PFields are garbage collected so this will be automatically taken care of later.
			auto newfield = new PField(membervar->SymbolName, membervar->Type, membervar->Flags | parentfield->Flags, membervar->Offset + parentfield->Offset);
			newfield->BitValue = membervar->BitValue;
			static_cast<FxStructMember *>(classx)->membervar = newfield;
			classx->isresolved = false;	// re-resolve the parent so it can also check if it can be optimized away.
			auto x = classx->Resolve(ctx);
			classx = nullptr;
			return x;
		}
		else if (classx->ExprType == EFX_GlobalVariable)
		{
			auto parentfield = static_cast<FxGlobalVariable *>(classx)->membervar;
			auto newfield = new PField(membervar->SymbolName, membervar->Type, membervar->Flags | parentfield->Flags, membervar->Offset + parentfield->Offset);
			newfield->BitValue = membervar->BitValue;
			static_cast<FxGlobalVariable *>(classx)->membervar = newfield;
			classx->isresolved = false;	// re-resolve the parent so it can also check if it can be optimized away.
			auto x = classx->Resolve(ctx);
			classx = nullptr;
			return x;
		}
		else if (classx->ExprType == EFX_StackVariable)
		{
			auto parentfield = static_cast<FxStackVariable *>(classx)->membervar;
			auto newfield = new PField(membervar->SymbolName, membervar->Type, membervar->Flags | parentfield->Flags, membervar->Offset + parentfield->Offset);
			newfield->BitValue = membervar->BitValue;
			static_cast<FxStackVariable *>(classx)->ReplaceField(newfield);
			classx->isresolved = false;	// re-resolve the parent so it can also check if it can be optimized away.
			auto x = classx->Resolve(ctx);
			classx = nullptr;
			return x;
		}
		else if (classx->ExprType == EFX_LocalVariable && classx->IsVector())	// vectors are a special case because they are held in registers
		{
			// since this is a vector, all potential things that may get here are single float or an xy-vector.
			auto locvar = static_cast<FxLocalVariable *>(classx);
			locvar->RegOffset = int(membervar->Offset / 8);
			locvar->ValueType = membervar->Type;
			classx = nullptr;
			delete this;
			return locvar;
		}
		else if (classx->ExprType == EFX_LocalVariable && classx->ValueType == TypeColorStruct)
		{
			// This needs special treatment because it'd require accessing the register via address.
			// Fortunately this is the only place where this kind of access is ever needed so an explicit handling is acceptable.
			int bits;
			switch (membervar->SymbolName.GetIndex())
			{
			case NAME_a: bits = 24; break;
			case NAME_r: bits = 16; break;
			case NAME_g: bits = 8; break;
			case NAME_b: default: bits = 0; break;
			}
			classx->ValueType = TypeColor;	// need to set it back.
			FxExpression *x = classx;
			if (bits > 0) x = new FxShift(TK_URShift, x, new FxConstant(bits, ScriptPosition));
			x = new FxBitOp('&', x, new FxConstant(255, ScriptPosition));
			classx = nullptr;
			delete this;
			return x->Resolve(ctx);
		}
		else
		{
			if (!(classx->RequestAddress(ctx, &AddressWritable)))
			{
				ScriptPosition.Message(MSG_ERROR, "unable to dereference left side of %s", membervar->SymbolName.GetChars());
				delete this;
				return nullptr;
			}
		}
	}
	ValueType = membervar->Type;
	return this;
}